

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Skip(TestInfo *this)

{
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar1;
  TestPartResult *this_02;
  TestPartResultReporterInterface *pTVar2;
  TestInfo *in_RDI;
  TestPartResult test_part_result;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  undefined1 local_88 [40];
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  TestPartResult *in_stack_ffffffffffffffc0;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_00,in_RDI);
    UnitTest::GetInstance();
    this_01 = UnitTest::listeners((UnitTest *)0x13b986);
    pTVar1 = TestEventListeners::repeater(this_01);
    (*pTVar1->_vptr_TestEventListener[8])(pTVar1,in_RDI);
    this_02 = (TestPartResult *)file((TestInfo *)0x13b9b6);
    line(in_RDI);
    TestPartResult::TestPartResult
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    pTVar2 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread
                       ((UnitTestImpl *)0x13b9ef);
    (*pTVar2->_vptr_TestPartResultReporterInterface[2])(pTVar2,local_88);
    (*pTVar1->_vptr_TestEventListener[0xb])(pTVar1,in_RDI);
    internal::UnitTestImpl::set_current_test_info(this_00,(TestInfo *)0x0);
    TestPartResult::~TestPartResult(this_02);
  }
  return;
}

Assistant:

void TestInfo::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TestPartResult test_part_result =
      TestPartResult(TestPartResult::kSkip, this->file(), this->line(), "");
  impl->GetTestPartResultReporterForCurrentThread()->ReportTestPartResult(
      test_part_result);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);
  impl->set_current_test_info(nullptr);
}